

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O3

void __thiscall cashew::ValueBuilder::appendToVar(ValueBuilder *this,Ref var,IString name,Ref value)

{
  bool bVar1;
  Ref *pRVar2;
  Value *pVVar3;
  Ref RVar4;
  undefined1 *__ptr;
  Ref local_40;
  Ref var_local;
  Ref value_local;
  
  var_local.inst = (Value *)name.str._M_str;
  local_40.inst = (Value *)this;
  pRVar2 = Ref::operator[](&local_40,0);
  bVar1 = Ref::operator==(pRVar2,(IString *)&VAR);
  if (bVar1) {
    pVVar3 = (Value *)MixedArena::allocSpace((MixedArena *)arena,0x18,8);
    pVVar3->type = Null;
    pVVar3 = cashew::Value::setArray(pVVar3,1);
    __ptr = &DAT_00000018;
    RVar4.inst = (Value *)MixedArena::allocSpace((MixedArena *)arena,0x18,8);
    (RVar4.inst)->type = Null;
    cashew::Value::free(RVar4.inst,__ptr);
    (RVar4.inst)->type = String;
    ((RVar4.inst)->field_1).ref.inst = var.inst;
    ((RVar4.inst)->field_1).str.str._M_str = (char *)name.str._M_len;
    RVar4.inst = cashew::Value::push_back(pVVar3,RVar4);
    bVar1 = Ref::operator!(&var_local);
    if (!bVar1) {
      cashew::Value::push_back(RVar4.inst,var_local);
    }
    pRVar2 = Ref::operator[](&local_40,1);
    cashew::Value::push_back(pRVar2->inst,RVar4);
    return;
  }
  __assert_fail("var[0] == VAR",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/emscripten-optimizer/simple_ast.h"
                ,0x688,"static void cashew::ValueBuilder::appendToVar(Ref, IString, Ref)");
}

Assistant:

static void appendToVar(Ref var, IString name, Ref value) {
    assert(var[0] == VAR);
    Ref array = &makeRawArray(1)->push_back(makeRawString(name));
    if (!!value) {
      array->push_back(value);
    }
    var[1]->push_back(array);
  }